

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O2

int __thiscall KParser::_adv_expr(KParser *this,int begin,BlockInfo *bi)

{
  int iVar1;
  BlockInfo BStack_58;
  
  BlockInfo::BlockInfo(&BStack_58,bi);
  iVar1 = _or_expr(this,begin,&BStack_58);
  BlockInfo::~BlockInfo(&BStack_58);
  return iVar1;
}

Assistant:

int KParser::_adv_expr(int begin,  BlockInfo bi) {
    return _or_expr(begin, bi);
}